

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

void xmlNodeSetContentLen(xmlNodePtr cur,xmlChar *content,int len)

{
  int iVar1;
  xmlNodePtr pxVar2;
  xmlChar *pxVar3;
  _xmlNode *local_28;
  xmlNodePtr ulccur;
  int len_local;
  xmlChar *content_local;
  xmlNodePtr cur_local;
  
  if (cur != (xmlNodePtr)0x0) {
    switch(cur->type) {
    case XML_ELEMENT_NODE:
    case XML_ATTRIBUTE_NODE:
    case XML_DOCUMENT_FRAG_NODE:
      if (cur->children != (_xmlNode *)0x0) {
        xmlFreeNodeList(cur->children);
      }
      pxVar2 = xmlStringLenGetNodeList(cur->doc,content,len);
      cur->children = pxVar2;
      if (cur != (xmlNodePtr)0x0) {
        local_28 = cur->children;
        if (local_28 == (_xmlNode *)0x0) {
          cur->last = (_xmlNode *)0x0;
        }
        else {
          for (; local_28->next != (_xmlNode *)0x0; local_28 = local_28->next) {
            local_28->parent = cur;
          }
          local_28->parent = cur;
          cur->last = local_28;
        }
      }
      break;
    case XML_TEXT_NODE:
    case XML_CDATA_SECTION_NODE:
    case XML_ENTITY_REF_NODE:
    case XML_ENTITY_NODE:
    case XML_PI_NODE:
    case XML_COMMENT_NODE:
    case XML_NOTATION_NODE:
      if (((cur->content != (xmlChar *)0x0) && ((_xmlAttr **)cur->content != &cur->properties)) &&
         ((cur->doc == (_xmlDoc *)0x0 ||
          ((cur->doc->dict == (_xmlDict *)0x0 ||
           (iVar1 = xmlDictOwns(cur->doc->dict,cur->content), iVar1 == 0)))))) {
        (*xmlFree)(cur->content);
      }
      if (cur->children != (_xmlNode *)0x0) {
        xmlFreeNodeList(cur->children);
      }
      cur->last = (_xmlNode *)0x0;
      cur->children = (_xmlNode *)0x0;
      if (content == (xmlChar *)0x0) {
        cur->content = (xmlChar *)0x0;
      }
      else {
        pxVar3 = xmlStrndup(content,len);
        cur->content = pxVar3;
      }
      cur->properties = (_xmlAttr *)0x0;
      break;
    case XML_DOCUMENT_NODE:
    case XML_DOCUMENT_TYPE_NODE:
    case XML_HTML_DOCUMENT_NODE:
    case XML_DTD_NODE:
    case XML_NAMESPACE_DECL:
    case XML_XINCLUDE_START:
    case XML_XINCLUDE_END:
      break;
    case XML_ELEMENT_DECL:
      break;
    case XML_ATTRIBUTE_DECL:
      break;
    case XML_ENTITY_DECL:
    }
  }
  return;
}

Assistant:

void
xmlNodeSetContentLen(xmlNodePtr cur, const xmlChar *content, int len) {
    if (cur == NULL) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlNodeSetContentLen : node == NULL\n");
#endif
	return;
    }
    switch (cur->type) {
        case XML_DOCUMENT_FRAG_NODE:
        case XML_ELEMENT_NODE:
        case XML_ATTRIBUTE_NODE:
	    if (cur->children != NULL) xmlFreeNodeList(cur->children);
	    cur->children = xmlStringLenGetNodeList(cur->doc, content, len);
	    UPDATE_LAST_CHILD_AND_PARENT(cur)
	    break;
        case XML_TEXT_NODE:
        case XML_CDATA_SECTION_NODE:
        case XML_ENTITY_REF_NODE:
        case XML_ENTITY_NODE:
        case XML_PI_NODE:
        case XML_COMMENT_NODE:
        case XML_NOTATION_NODE:
	    if ((cur->content != NULL) &&
	        (cur->content != (xmlChar *) &(cur->properties))) {
	        if (!((cur->doc != NULL) && (cur->doc->dict != NULL) &&
		    (xmlDictOwns(cur->doc->dict, cur->content))))
		    xmlFree(cur->content);
	    }
	    if (cur->children != NULL) xmlFreeNodeList(cur->children);
	    cur->children = cur->last = NULL;
	    if (content != NULL) {
		cur->content = xmlStrndup(content, len);
	    } else
		cur->content = NULL;
	    cur->properties = NULL;
	    break;
        case XML_DOCUMENT_NODE:
        case XML_DTD_NODE:
        case XML_HTML_DOCUMENT_NODE:
        case XML_DOCUMENT_TYPE_NODE:
	case XML_NAMESPACE_DECL:
	case XML_XINCLUDE_START:
	case XML_XINCLUDE_END:
	    break;
        case XML_ELEMENT_DECL:
	    /* TODO !!! */
	    break;
        case XML_ATTRIBUTE_DECL:
	    /* TODO !!! */
	    break;
        case XML_ENTITY_DECL:
	    /* TODO !!! */
	    break;
    }
}